

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O1

void testAttrListHelper(exr_context_t f)

{
  exr_result_t eVar1;
  ostream *poVar2;
  size_t sVar3;
  char *in_RCX;
  exr_attribute_t **ppeVar4;
  char *pcVar5;
  char *pcVar6;
  exr_attribute_t *out;
  exr_attribute_list_t al;
  uint8_t *extra;
  uint64_t sz;
  exr_attribute_t *out2;
  exr_attribute_t *local_60;
  exr_attribute_list_t local_58;
  uint8_t *local_38;
  uint64_t local_30;
  exr_attribute_t *local_28;
  
  local_58.num_attributes = 0;
  local_58.num_alloced = 0;
  local_58.entries = (exr_attribute_t **)0x0;
  local_58.sorted_entries = (exr_attribute_t **)0x0;
  if (f == (exr_context_t)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(2);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_destroy (f, __null)",(char *)0x475,0x34a949,in_RCX);
  }
  eVar1 = exr_attr_list_destroy(f,&local_58);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_destroy (f, &al)",(char *)0x476,0x34a949,in_RCX);
  }
  ppeVar4 = &local_60;
  eVar1 = exr_attr_list_find_by_name(f,&local_58,"exr",ppeVar4);
  if (eVar1 != 0xf) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(0xf);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_find_by_name (f, &al, \"exr\", &out)",(char *)0x479,0x34a949,
                   (char *)ppeVar4);
  }
  if (f == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    eVar1 = (*f->report_error)(f,3,"Invalid list pointer passed to find_by_name");
  }
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(3);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_find_by_name (f, __null, \"exr\", &out)",(char *)0x47f,0x34a949,
                   (char *)ppeVar4);
  }
  if (f == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    eVar1 = (*f->report_error)(f,3,"Invalid output pointer passed to find_by_name");
  }
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(3);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_find_by_name (f, &al, \"exr\", __null)",(char *)0x482,0x34a949,
                   (char *)ppeVar4);
  }
  if (f == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    eVar1 = (*f->report_error)(f,3,"Invalid name passed to find_by_name");
  }
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(3);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_find_by_name (f, &al, __null, &out)",(char *)0x485,0x34a949,
                   (char *)ppeVar4);
  }
  ppeVar4 = &local_60;
  eVar1 = exr_attr_list_find_by_name(f,&local_58,"",&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(3);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_find_by_name (f, &al, \"\", &out)",(char *)0x488,0x34a949,
                   (char *)ppeVar4);
  }
  if (f == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    eVar1 = (*f->report_error)(f,3,"Missing list to compute size");
  }
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(3);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_compute_size (f, __null, __null)",(char *)0x48a,0x34a949,
                   (char *)ppeVar4);
  }
  if (f == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    eVar1 = (*f->report_error)(f,3,"Expected output pointer");
  }
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(3);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_compute_size (f, &al, __null)",(char *)0x48c,0x34a949,
                   (char *)ppeVar4);
  }
  if (f == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    eVar1 = (*f->report_error)(f,3,"Missing list to compute size");
  }
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(3);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_compute_size (f, __null, &sz)",(char *)0x491,0x34a949,
                   (char *)ppeVar4);
  }
  eVar1 = exr_attr_list_compute_size(f,&local_58,&local_30);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_compute_size (f, &al, &sz)",(char *)0x492,0x34a949,(char *)ppeVar4
                  );
  }
  if (local_30 != 0) {
    core_test_fail("0 == sz",(char *)0x493,0x34a949,(char *)ppeVar4);
  }
  pcVar5 = "mytype";
  eVar1 = exr_attr_list_add_by_type
                    (f,(exr_attribute_list_t *)0x0,"myattr","mytype",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, __null, \"myattr\", \"mytype\", 0, __null, &out)",
                   (char *)0x497,0x34a949,pcVar5);
  }
  pcVar5 = "mytype";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,(char *)0x0,"mytype",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, __null, \"mytype\", 0, __null, &out)",
                   (char *)0x49a,0x34a949,pcVar5);
  }
  pcVar5 = "mytype";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"","mytype",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"\", \"mytype\", 0, __null, &out)",
                   (char *)0x49d,0x34a949,pcVar5);
  }
  if (f == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    eVar1 = (*f->report_error)(f,3,"Invalid type to add_by_type");
  }
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"myattr\", __null, 0, __null, &out)",
                   (char *)0x4a0,0x34a949,pcVar5);
  }
  pcVar5 = "";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"myattr","",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"myattr\", \"\", 0, __null, &out)",
                   (char *)0x4a3,0x34a949,pcVar5);
  }
  pcVar5 = "mytype";
  eVar1 = exr_attr_list_add_by_type
                    (f,&local_58,"myattr","mytype",0,(uint8_t **)0x0,(exr_attribute_t **)0x0);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"myattr\", \"mytype\", 0, __null, __null)",
                   (char *)0x4a6,0x34a949,pcVar5);
  }
  pcVar5 = "mytype";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"myattr","mytype",-1,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"myattr\", \"mytype\", -1, __null, &out)",
                   (char *)0x4a9,0x34a949,pcVar5);
  }
  pcVar5 = "mytype";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"myattr","mytype",1,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"myattr\", \"mytype\", 1, __null, &out)",
                   (char *)0x4ac,0x34a949,pcVar5);
  }
  pcVar5 = "mytype";
  eVar1 = exr_attr_list_add_by_type
                    (f,(exr_attribute_list_t *)0x0,"myattr","mytype",1,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, __null, \"myattr\", \"mytype\", 1, __null, &out)",
                   (char *)0x4b0,0x34a949,pcVar5);
  }
  pcVar5 = "mytype";
  eVar1 = exr_attr_list_add_by_type
                    (f,&local_58,"myattr","mytype",1,(uint8_t **)0x0,(exr_attribute_t **)0x0);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"myattr\", \"mytype\", 1, __null, __null)",
                   (char *)0x4b3,0x34a949,pcVar5);
  }
  pcVar5 = "mytype";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"myattr","mytype",-1,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"myattr\", \"mytype\", -1, __null, &out)",
                   (char *)0x4b6,0x34a949,pcVar5);
  }
  pcVar5 = "mytype";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"myattr","mytype",1,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"myattr\", \"mytype\", 1, __null, &out)",
                   (char *)0x4b9,0x34a949,pcVar5);
  }
  pcVar5 = "box2i";
  eVar1 = exr_attr_list_add_by_type
                    (f,&local_58,"reallongreallongreallonglongname","box2i",0,(uint8_t **)0x0,
                     &local_60);
  if (eVar1 != 0xc) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(0xc);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type ( f, &al, \"reallongreallongreallonglongname\", \"box2i\", 0, __null, &out)"
                   ,(char *)0x4c4,0x34a949,pcVar5);
  }
  pcVar5 = "reallongreallongreallonglongname";
  eVar1 = exr_attr_list_add_by_type
                    (f,&local_58,"x","reallongreallongreallonglongname",0,(uint8_t **)0x0,&local_60)
  ;
  if (eVar1 != 0xc) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(0xc);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type ( f, &al, \"x\", \"reallongreallongreallonglongname\", 0, __null, &out)"
                   ,(char *)0x4c8,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x13;
  eVar1 = exr_attr_list_add(f,(exr_attribute_list_t *)0x0,"myattr",EXR_ATTR_STRING,0,(uint8_t **)0x0
                            ,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, __null, \"myattr\", EXR_ATTR_STRING, 0, __null, &out)",
                   (char *)0x4d0,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x13;
  eVar1 = exr_attr_list_add(f,&local_58,(char *)0x0,EXR_ATTR_STRING,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, __null, EXR_ATTR_STRING, 0, __null, &out)",
                   (char *)0x4d3,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x13;
  eVar1 = exr_attr_list_add(f,&local_58,"",EXR_ATTR_STRING,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"\", EXR_ATTR_STRING, 0, __null, &out)",
                   (char *)0x4d6,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x1f;
  eVar1 = exr_attr_list_add(f,&local_58,"myattr",EXR_ATTR_LAST_KNOWN_TYPE,0,(uint8_t **)0x0,
                            &local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add ( f, &al, \"myattr\", EXR_ATTR_LAST_KNOWN_TYPE, 0, __null, &out)"
                   ,(char *)0x4da,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x0;
  eVar1 = exr_attr_list_add(f,&local_58,"myattr",EXR_ATTR_UNKNOWN,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"myattr\", EXR_ATTR_UNKNOWN, 0, __null, &out)",
                   (char *)0x4dd,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0xffffffff;
  eVar1 = exr_attr_list_add(f,&local_58,"myattr",~EXR_ATTR_UNKNOWN,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add ( f, &al, \"myattr\", (exr_attribute_type_t) -1, 0, __null, &out)"
                   ,(char *)0x4e1,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x13;
  eVar1 = exr_attr_list_add(f,&local_58,"myattr",EXR_ATTR_STRING,0,(uint8_t **)0x0,
                            (exr_attribute_t **)0x0);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"myattr\", EXR_ATTR_STRING, 0, __null, __null)",
                   (char *)0x4e4,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x13;
  eVar1 = exr_attr_list_add(f,&local_58,"myattr",EXR_ATTR_STRING,-1,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"myattr\", EXR_ATTR_STRING, -1, __null, &out)",
                   (char *)0x4e7,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x13;
  eVar1 = exr_attr_list_add(f,&local_58,"myattr",EXR_ATTR_STRING,1,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"myattr\", EXR_ATTR_STRING, 1, __null, &out)",
                   (char *)0x4ea,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x13;
  eVar1 = exr_attr_list_add_static_name
                    (f,(exr_attribute_list_t *)0x0,"myattr",EXR_ATTR_STRING,0,(uint8_t **)0x0,
                     &local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, __null, \"myattr\", EXR_ATTR_STRING, 0, __null, &out)"
                   ,(char *)0x4ef,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x13;
  eVar1 = exr_attr_list_add_static_name
                    (f,&local_58,(char *)0x0,EXR_ATTR_STRING,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, __null, EXR_ATTR_STRING, 0, __null, &out)"
                   ,(char *)0x4f3,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x13;
  eVar1 = exr_attr_list_add_static_name(f,&local_58,"",EXR_ATTR_STRING,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"\", EXR_ATTR_STRING, 0, __null, &out)"
                   ,(char *)0x4f7,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x1f;
  eVar1 = exr_attr_list_add_static_name
                    (f,&local_58,"myattr",EXR_ATTR_LAST_KNOWN_TYPE,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"myattr\", EXR_ATTR_LAST_KNOWN_TYPE, 0, __null, &out)"
                   ,(char *)0x4fb,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x0;
  eVar1 = exr_attr_list_add_static_name
                    (f,&local_58,"myattr",EXR_ATTR_UNKNOWN,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"myattr\", EXR_ATTR_UNKNOWN, 0, __null, &out)"
                   ,(char *)0x4ff,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0xffffffff;
  eVar1 = exr_attr_list_add_static_name
                    (f,&local_58,"myattr",~EXR_ATTR_UNKNOWN,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"myattr\", (exr_attribute_type_t) -1, 0, __null, &out)"
                   ,(char *)0x503,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x13;
  eVar1 = exr_attr_list_add_static_name
                    (f,&local_58,"myattr",EXR_ATTR_STRING,0,(uint8_t **)0x0,(exr_attribute_t **)0x0)
  ;
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"myattr\", EXR_ATTR_STRING, 0, __null, __null)"
                   ,(char *)0x507,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x13;
  eVar1 = exr_attr_list_add_static_name
                    (f,&local_58,"myattr",EXR_ATTR_STRING,-1,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"myattr\", EXR_ATTR_STRING, -1, __null, &out)"
                   ,(char *)0x50b,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x13;
  eVar1 = exr_attr_list_add_static_name
                    (f,&local_58,"myattr",EXR_ATTR_STRING,1,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"myattr\", EXR_ATTR_STRING, 1, __null, &out)"
                   ,(char *)0x50f,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x13;
  eVar1 = exr_attr_list_add_static_name
                    (f,&local_58,"myattr",EXR_ATTR_STRING,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"myattr\", EXR_ATTR_STRING, 0, __null, &out)"
                   ,(char *)0x512,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x13;
  eVar1 = exr_attr_list_add_static_name
                    (f,&local_58,"xxx",EXR_ATTR_STRING,0,(uint8_t **)0x0,&local_28);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"xxx\", EXR_ATTR_STRING, 0, __null, &out2)"
                   ,(char *)0x514,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x13;
  eVar1 = exr_attr_list_add_static_name
                    (f,&local_58,"yyy",EXR_ATTR_STRING,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"yyy\", EXR_ATTR_STRING, 0, __null, &out)"
                   ,(char *)0x516,0x34a949,pcVar5);
  }
  if (f == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    eVar1 = (*f->report_error)(f,3,"NULL attribute passed to remove");
  }
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_remove (f, __null, __null)",(char *)0x51a,0x34a949,pcVar5);
  }
  if (f == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    eVar1 = (*f->report_error)(f,3,"NULL attribute passed to remove");
  }
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_remove (f, &al, __null)",(char *)0x51c,0x34a949,pcVar5);
  }
  if (f == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    pcVar6 = "Invalid list pointer to remove attribute";
    if (local_60 == (exr_attribute_t *)0x0) {
      pcVar6 = "NULL attribute passed to remove";
    }
    eVar1 = (*f->report_error)(f,3,pcVar6);
  }
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_remove (f, __null, out)",(char *)0x51e,0x34a949,pcVar5);
  }
  eVar1 = exr_attr_list_remove(f,&local_58,local_28);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_remove (f, &al, out2)",(char *)0x51f,0x34a949,pcVar5);
  }
  eVar1 = exr_attr_list_remove(f,&local_58,local_28);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_remove (f, &al, out2)",(char *)0x521,0x34a949,pcVar5);
  }
  if (local_58.num_attributes != 2) {
    core_test_fail("al.num_attributes == 2",(char *)0x522,0x34a949,pcVar5);
  }
  pcVar5 = "string";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"tnst42","string",0x2a,&local_38,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type ( f, &al, \"tnst42\", \"string\", 42, &extra, &out)",
                   (char *)0x525,0x34a949,pcVar5);
  }
  if (local_38 == (uint8_t *)0x0) {
    core_test_fail("extra != __null",(char *)0x526,0x34a949,pcVar5);
  }
  pcVar5 = "string";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"tnst0","string",0,&local_38,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"tnst0\", \"string\", 0, &extra, &out)",
                   (char *)0x528,0x34a949,pcVar5);
  }
  if (local_38 != (uint8_t *)0x0) {
    core_test_fail("extra == __null",(char *)0x529,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x13;
  eVar1 = exr_attr_list_add(f,&local_58,"nst42",EXR_ATTR_STRING,0x2a,&local_38,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"nst42\", EXR_ATTR_STRING, 42, &extra, &out)",
                   (char *)0x52b,0x34a949,pcVar5);
  }
  if (local_38 == (uint8_t *)0x0) {
    core_test_fail("extra != __null",(char *)0x52c,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x13;
  eVar1 = exr_attr_list_add(f,&local_58,"nst0",EXR_ATTR_STRING,0,&local_38,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"nst0\", EXR_ATTR_STRING, 0, &extra, &out)",
                   (char *)0x52e,0x34a949,pcVar5);
  }
  if (local_38 != (uint8_t *)0x0) {
    core_test_fail("extra == __null",(char *)0x52f,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x13;
  eVar1 = exr_attr_list_add_static_name(f,&local_58,"t42",EXR_ATTR_STRING,0x2a,&local_38,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"t42\", EXR_ATTR_STRING, 42, &extra, &out)"
                   ,(char *)0x531,0x34a949,pcVar5);
  }
  if (local_38 == (uint8_t *)0x0) {
    core_test_fail("extra != __null",(char *)0x532,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x13;
  eVar1 = exr_attr_list_add_static_name(f,&local_58,"t0",EXR_ATTR_STRING,0,&local_38,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"t0\", EXR_ATTR_STRING, 0, &extra, &out)"
                   ,(char *)0x534,0x34a949,pcVar5);
  }
  if (local_38 != (uint8_t *)0x0) {
    core_test_fail("extra == __null",(char *)0x535,0x34a949,pcVar5);
  }
  exr_attr_list_destroy(f,&local_58);
  pcVar5 = "mytype";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"a","mytype",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"a\", \"mytype\", 0, __null, &out)",
                   (char *)0x53a,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_OPAQUE) {
    core_test_fail("out->type == EXR_ATTR_OPAQUE",(char *)0x53b,0x34a949,pcVar5);
  }
  s_malloc_fail_on = 1;
  pcVar5 = "mytype";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"zzzz","mytype",0,(uint8_t **)0x0,&local_60);
  s_malloc_fail_on = 0;
  if (eVar1 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"zzzz\", \"mytype\", 0, __null, &out)",
                   (char *)0x53e,0x34a949,pcVar5);
  }
  pcVar5 = "box2i";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"a","box2i",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"a\", \"box2i\", 0, __null, &out)",
                   (char *)0x544,0x34a949,pcVar5);
  }
  pcVar5 = "box2i";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"b","box2i",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"b\", \"box2i\", 0, __null, &out)",
                   (char *)0x547,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_BOX2I) {
    core_test_fail("out->type == EXR_ATTR_BOX2I",(char *)0x548,0x34a949,pcVar5);
  }
  pcVar5 = "box2i";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"b","box2i",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"b\", \"box2i\", 0, __null, &out)",
                   (char *)0x54a,0x34a949,pcVar5);
  }
  if (local_58.num_attributes != 2) {
    core_test_fail("al.num_attributes == 2",(char *)0x54b,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_BOX2I) {
    core_test_fail("out->type == EXR_ATTR_BOX2I",(char *)0x54c,0x34a949,pcVar5);
  }
  pcVar5 = "box2i";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"b","box2i",3,&local_38,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"b\", \"box2i\", 3, &extra, &out)",
                   (char *)0x54f,0x34a949,pcVar5);
  }
  if (local_58.num_attributes != 2) {
    core_test_fail("al.num_attributes == 2",(char *)0x550,0x34a949,pcVar5);
  }
  if (local_58.num_alloced != 2) {
    core_test_fail("al.num_alloced == 2",(char *)0x552,0x34a949,pcVar5);
  }
  s_malloc_fail_on = 1;
  pcVar5 = "box2f";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"c","box2f",0,(uint8_t **)0x0,&local_60);
  s_malloc_fail_on = 0;
  if (eVar1 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"c\", \"box2f\", 0, __null, &out)",
                   (char *)0x555,0x34a949,pcVar5);
  }
  if (local_58.num_attributes != 2) {
    core_test_fail("al.num_attributes == 2",(char *)0x556,0x34a949,pcVar5);
  }
  if (local_58.num_alloced != 2) {
    core_test_fail("al.num_alloced == 2",(char *)0x557,0x34a949,pcVar5);
  }
  s_malloc_fail_on = 2;
  pcVar5 = "box2f";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"c","box2f",0,(uint8_t **)0x0,&local_60);
  s_malloc_fail_on = 0;
  if (eVar1 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"c\", \"box2f\", 0, __null, &out)",
                   (char *)0x55b,0x34a949,pcVar5);
  }
  if (local_58.num_attributes != 2) {
    core_test_fail("al.num_attributes == 2",(char *)0x55c,0x34a949,pcVar5);
  }
  pcVar5 = "box2f";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"c","box2f",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"c\", \"box2f\", 0, __null, &out)",
                   (char *)0x55f,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_BOX2F) {
    core_test_fail("out->type == EXR_ATTR_BOX2F",(char *)0x560,0x34a949,pcVar5);
  }
  pcVar5 = "chlist";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"d","chlist",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"d\", \"chlist\", 0, __null, &out)",
                   (char *)0x562,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_CHLIST) {
    core_test_fail("out->type == EXR_ATTR_CHLIST",(char *)0x563,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x1;
  eVar1 = exr_attr_chlist_add_with_length
                    (f,(local_60->field_6).chlist,"R",1,EXR_PIXEL_HALF,EXR_PERCEPTUALLY_LOGARITHMIC,
                     1,1);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add ( f, out->chlist, \"R\", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1)"
                   ,(char *)0x56b,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x1;
  eVar1 = exr_attr_chlist_add_with_length
                    (f,(local_60->field_6).chlist,"G",1,EXR_PIXEL_HALF,EXR_PERCEPTUALLY_LOGARITHMIC,
                     1,1);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add ( f, out->chlist, \"G\", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1)"
                   ,(char *)0x573,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x1;
  eVar1 = exr_attr_chlist_add_with_length
                    (f,(local_60->field_6).chlist,"B",1,EXR_PIXEL_HALF,EXR_PERCEPTUALLY_LOGARITHMIC,
                     1,1);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_chlist_add ( f, out->chlist, \"B\", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1)"
                   ,(char *)0x57b,0x34a949,pcVar5);
  }
  pcVar5 = "chromaticities";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"e","chromaticities",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type ( f, &al, \"e\", \"chromaticities\", 0, __null, &out)"
                   ,(char *)0x57e,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_CHROMATICITIES) {
    core_test_fail("out->type == EXR_ATTR_CHROMATICITIES",(char *)0x57f,0x34a949,pcVar5);
  }
  pcVar5 = "compression";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"f","compression",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"f\", \"compression\", 0, __null, &out)",
                   (char *)0x581,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_COMPRESSION) {
    core_test_fail("out->type == EXR_ATTR_COMPRESSION",(char *)0x582,0x34a949,pcVar5);
  }
  pcVar5 = "double";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"g","double",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"g\", \"double\", 0, __null, &out)",
                   (char *)0x584,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_DOUBLE) {
    core_test_fail("out->type == EXR_ATTR_DOUBLE",(char *)0x585,0x34a949,pcVar5);
  }
  pcVar5 = "envmap";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"h","envmap",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"h\", \"envmap\", 0, __null, &out)",
                   (char *)0x587,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_ENVMAP) {
    core_test_fail("out->type == EXR_ATTR_ENVMAP",(char *)0x588,0x34a949,pcVar5);
  }
  pcVar5 = "float";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"i","float",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"i\", \"float\", 0, __null, &out)",
                   (char *)0x58a,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_FLOAT) {
    core_test_fail("out->type == EXR_ATTR_FLOAT",(char *)0x58b,0x34a949,pcVar5);
  }
  pcVar5 = "floatvector";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"j","floatvector",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"j\", \"floatvector\", 0, __null, &out)",
                   (char *)0x58d,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_FLOAT_VECTOR) {
    core_test_fail("out->type == EXR_ATTR_FLOAT_VECTOR",(char *)0x58e,0x34a949,pcVar5);
  }
  eVar1 = exr_attr_float_vector_init(f,(local_60->field_6).floatvector,4);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_init (f, out->floatvector, 4)",(char *)0x58f,0x34a949,
                   pcVar5);
  }
  pcVar5 = "int";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"k","int",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"k\", \"int\", 0, __null, &out)",
                   (char *)0x592,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_INT) {
    core_test_fail("out->type == EXR_ATTR_INT",(char *)0x593,0x34a949,pcVar5);
  }
  pcVar5 = "keycode";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"l","keycode",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"l\", \"keycode\", 0, __null, &out)",
                   (char *)0x595,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_KEYCODE) {
    core_test_fail("out->type == EXR_ATTR_KEYCODE",(char *)0x596,0x34a949,pcVar5);
  }
  pcVar5 = "lineOrder";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"m","lineOrder",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"m\", \"lineOrder\", 0, __null, &out)",
                   (char *)0x598,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_LINEORDER) {
    core_test_fail("out->type == EXR_ATTR_LINEORDER",(char *)0x599,0x34a949,pcVar5);
  }
  pcVar5 = "m33f";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"n","m33f",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"n\", \"m33f\", 0, __null, &out)",
                   (char *)0x59b,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_M33F) {
    core_test_fail("out->type == EXR_ATTR_M33F",(char *)0x59c,0x34a949,pcVar5);
  }
  pcVar5 = "m33d";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"o","m33d",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"o\", \"m33d\", 0, __null, &out)",
                   (char *)0x59e,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_M33D) {
    core_test_fail("out->type == EXR_ATTR_M33D",(char *)0x59f,0x34a949,pcVar5);
  }
  pcVar5 = "m44f";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"p","m44f",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"p\", \"m44f\", 0, __null, &out)",
                   (char *)0x5a1,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_M44F) {
    core_test_fail("out->type == EXR_ATTR_M44F",(char *)0x5a2,0x34a949,pcVar5);
  }
  pcVar5 = "m44d";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"q","m44d",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"q\", \"m44d\", 0, __null, &out)",
                   (char *)0x5a4,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_M44D) {
    core_test_fail("out->type == EXR_ATTR_M44D",(char *)0x5a5,0x34a949,pcVar5);
  }
  pcVar5 = "preview";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"r","preview",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"r\", \"preview\", 0, __null, &out)",
                   (char *)0x5a7,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_PREVIEW) {
    core_test_fail("out->type == EXR_ATTR_PREVIEW",(char *)0x5a8,0x34a949,pcVar5);
  }
  pcVar5 = "rational";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"s","rational",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"s\", \"rational\", 0, __null, &out)",
                   (char *)0x5aa,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_RATIONAL) {
    core_test_fail("out->type == EXR_ATTR_RATIONAL",(char *)0x5ab,0x34a949,pcVar5);
  }
  pcVar5 = "string";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"t","string",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"t\", \"string\", 0, __null, &out)",
                   (char *)0x5ad,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_STRING) {
    core_test_fail("out->type == EXR_ATTR_STRING",(char *)0x5ae,0x34a949,pcVar5);
  }
  pcVar5 = "stringvector";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"u","stringvector",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"u\", \"stringvector\", 0, __null, &out)",
                   (char *)0x5b0,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_STRING_VECTOR) {
    core_test_fail("out->type == EXR_ATTR_STRING_VECTOR",(char *)0x5b1,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x7;
  eVar1 = exr_attr_string_vector_add_entry_with_length
                    (f,(local_60->field_6).stringvector,"openexr",7);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_add_entry (f, out->stringvector, \"openexr\")",
                   (char *)0x5b3,0x34a949,pcVar5);
  }
  pcVar5 = "tiledesc";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"v","tiledesc",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"v\", \"tiledesc\", 0, __null, &out)",
                   (char *)0x5b6,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_TILEDESC) {
    core_test_fail("out->type == EXR_ATTR_TILEDESC",(char *)0x5b7,0x34a949,pcVar5);
  }
  pcVar5 = "timecode";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"w","timecode",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"w\", \"timecode\", 0, __null, &out)",
                   (char *)0x5b9,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_TIMECODE) {
    core_test_fail("out->type == EXR_ATTR_TIMECODE",(char *)0x5ba,0x34a949,pcVar5);
  }
  pcVar5 = "v2i";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"x","v2i",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"x\", \"v2i\", 0, __null, &out)",
                   (char *)0x5bc,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_V2I) {
    core_test_fail("out->type == EXR_ATTR_V2I",(char *)0x5bd,0x34a949,pcVar5);
  }
  pcVar5 = "v2f";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"y","v2f",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"y\", \"v2f\", 0, __null, &out)",
                   (char *)0x5bf,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_V2F) {
    core_test_fail("out->type == EXR_ATTR_V2F",(char *)0x5c0,0x34a949,pcVar5);
  }
  pcVar5 = "v2d";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"z","v2d",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"z\", \"v2d\", 0, __null, &out)",
                   (char *)0x5c2,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_V2D) {
    core_test_fail("out->type == EXR_ATTR_V2D",(char *)0x5c3,0x34a949,pcVar5);
  }
  pcVar5 = "v3i";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"0","v3i",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"0\", \"v3i\", 0, __null, &out)",
                   (char *)0x5c5,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_V3I) {
    core_test_fail("out->type == EXR_ATTR_V3I",(char *)0x5c6,0x34a949,pcVar5);
  }
  pcVar5 = "v3f";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"1","v3f",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"1\", \"v3f\", 0, __null, &out)",
                   (char *)0x5c8,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_V3F) {
    core_test_fail("out->type == EXR_ATTR_V3F",(char *)0x5c9,0x34a949,pcVar5);
  }
  pcVar5 = "v3d";
  eVar1 = exr_attr_list_add_by_type(f,&local_58,"2","v3d",0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_by_type (f, &al, \"2\", \"v3d\", 0, __null, &out)",
                   (char *)0x5cb,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_V3D) {
    core_test_fail("out->type == EXR_ATTR_V3D",(char *)0x5cc,0x34a949,pcVar5);
  }
  if (local_58.num_attributes != 0x1d) {
    core_test_fail("al.num_attributes == 29",(char *)0x5cd,0x34a949,pcVar5);
  }
  eVar1 = exr_attr_list_compute_size(f,&local_58,&local_30);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_compute_size (f, &al, &sz)",(char *)0x5ce,0x34a949,pcVar5);
  }
  ppeVar4 = &local_60;
  eVar1 = exr_attr_list_find_by_name(f,&local_58,"x",ppeVar4);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_find_by_name (f, &al, \"x\", &out)",(char *)0x5cf,0x34a949,
                   (char *)ppeVar4);
  }
  if (local_60->type != EXR_ATTR_V2I) {
    core_test_fail("out->type == EXR_ATTR_V2I",(char *)0x5d0,0x34a949,(char *)ppeVar4);
  }
  ppeVar4 = &local_60;
  eVar1 = exr_attr_list_find_by_name(f,&local_58,"a",&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar5 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_find_by_name (f, &al, \"a\", &out)",(char *)0x5d1,0x34a949,
                   (char *)ppeVar4);
  }
  if (local_60->type != EXR_ATTR_OPAQUE) {
    core_test_fail("out->type == EXR_ATTR_OPAQUE",(char *)0x5d2,0x34a949,(char *)ppeVar4);
  }
  exr_attr_list_destroy(f,&local_58);
  exr_attr_list_destroy(f,&local_58);
  pcVar5 = (char *)0x1;
  eVar1 = exr_attr_list_add(f,&local_58,"b",EXR_ATTR_BOX2I,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"b\", EXR_ATTR_BOX2I, 0, __null, &out)",
                   (char *)0x5d9,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_BOX2I) {
    core_test_fail("out->type == EXR_ATTR_BOX2I",(char *)0x5da,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x2;
  eVar1 = exr_attr_list_add(f,&local_58,"b",EXR_ATTR_BOX2F,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"b\", EXR_ATTR_BOX2F, 0, __null, &out)",
                   (char *)0x5dd,0x34a949,pcVar5);
  }
  if (local_60 != (exr_attribute_t *)0x0) {
    core_test_fail("out == __null",(char *)0x5de,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x1;
  eVar1 = exr_attr_list_add(f,&local_58,"b",EXR_ATTR_BOX2I,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"b\", EXR_ATTR_BOX2I, 0, __null, &out)",
                   (char *)0x5e0,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_BOX2I) {
    core_test_fail("out->type == EXR_ATTR_BOX2I",(char *)0x5e1,0x34a949,pcVar5);
  }
  if (local_58.num_attributes != 1) {
    core_test_fail("al.num_attributes == 1",(char *)0x5e2,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x1;
  eVar1 = exr_attr_list_add(f,&local_58,"reallongreallongreallonglongname",EXR_ATTR_BOX2I,0,
                            (uint8_t **)0x0,&local_60);
  if (eVar1 != 0xc) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(0xc);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add ( f, &al, \"reallongreallongreallonglongname\", EXR_ATTR_BOX2I, 0, __null, &out)"
                   ,(char *)0x5ec,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x1e;
  eVar1 = exr_attr_list_add(f,&local_58,"yyy",EXR_ATTR_OPAQUE,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"yyy\", EXR_ATTR_OPAQUE, 0, __null, &out)",
                   (char *)0x5ef,0x34a949,pcVar5);
  }
  s_malloc_fail_on = 1;
  pcVar5 = (char *)0x2;
  eVar1 = exr_attr_list_add(f,&local_58,"c",EXR_ATTR_BOX2F,0,(uint8_t **)0x0,&local_60);
  s_malloc_fail_on = 0;
  if (eVar1 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"c\", EXR_ATTR_BOX2F, 0, __null, &out)",
                   (char *)0x5f3,0x34a949,pcVar5);
  }
  if (local_58.num_attributes != 1) {
    core_test_fail("al.num_attributes == 1",(char *)0x5f4,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x2;
  eVar1 = exr_attr_list_add(f,&local_58,"c",EXR_ATTR_BOX2F,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"c\", EXR_ATTR_BOX2F, 0, __null, &out)",
                   (char *)0x5f7,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_BOX2F) {
    core_test_fail("out->type == EXR_ATTR_BOX2F",(char *)0x5f8,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x3;
  eVar1 = exr_attr_list_add(f,&local_58,"d",EXR_ATTR_CHLIST,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"d\", EXR_ATTR_CHLIST, 0, __null, &out)",
                   (char *)0x5fa,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_CHLIST) {
    core_test_fail("out->type == EXR_ATTR_CHLIST",(char *)0x5fb,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x4;
  eVar1 = exr_attr_list_add(f,&local_58,"e",EXR_ATTR_CHROMATICITIES,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add ( f, &al, \"e\", EXR_ATTR_CHROMATICITIES, 0, __null, &out)",
                   (char *)0x5fd,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_CHROMATICITIES) {
    core_test_fail("out->type == EXR_ATTR_CHROMATICITIES",(char *)0x5fe,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x5;
  eVar1 = exr_attr_list_add(f,&local_58,"f",EXR_ATTR_COMPRESSION,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"f\", EXR_ATTR_COMPRESSION, 0, __null, &out)",
                   (char *)0x600,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_COMPRESSION) {
    core_test_fail("out->type == EXR_ATTR_COMPRESSION",(char *)0x601,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x6;
  eVar1 = exr_attr_list_add(f,&local_58,"g",EXR_ATTR_DOUBLE,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"g\", EXR_ATTR_DOUBLE, 0, __null, &out)",
                   (char *)0x603,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_DOUBLE) {
    core_test_fail("out->type == EXR_ATTR_DOUBLE",(char *)0x604,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x7;
  eVar1 = exr_attr_list_add(f,&local_58,"h",EXR_ATTR_ENVMAP,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"h\", EXR_ATTR_ENVMAP, 0, __null, &out)",
                   (char *)0x606,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_ENVMAP) {
    core_test_fail("out->type == EXR_ATTR_ENVMAP",(char *)0x607,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x8;
  eVar1 = exr_attr_list_add(f,&local_58,"i",EXR_ATTR_FLOAT,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"i\", EXR_ATTR_FLOAT, 0, __null, &out)",
                   (char *)0x609,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_FLOAT) {
    core_test_fail("out->type == EXR_ATTR_FLOAT",(char *)0x60a,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x9;
  eVar1 = exr_attr_list_add(f,&local_58,"j",EXR_ATTR_FLOAT_VECTOR,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"j\", EXR_ATTR_FLOAT_VECTOR, 0, __null, &out)",
                   (char *)0x60c,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_FLOAT_VECTOR) {
    core_test_fail("out->type == EXR_ATTR_FLOAT_VECTOR",(char *)0x60d,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0xa;
  eVar1 = exr_attr_list_add(f,&local_58,"k",EXR_ATTR_INT,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"k\", EXR_ATTR_INT, 0, __null, &out)",(char *)0x60f,
                   0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_INT) {
    core_test_fail("out->type == EXR_ATTR_INT",(char *)0x610,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0xb;
  eVar1 = exr_attr_list_add(f,&local_58,"l",EXR_ATTR_KEYCODE,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"l\", EXR_ATTR_KEYCODE, 0, __null, &out)",
                   (char *)0x612,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_KEYCODE) {
    core_test_fail("out->type == EXR_ATTR_KEYCODE",(char *)0x613,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0xc;
  eVar1 = exr_attr_list_add(f,&local_58,"m",EXR_ATTR_LINEORDER,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"m\", EXR_ATTR_LINEORDER, 0, __null, &out)",
                   (char *)0x615,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_LINEORDER) {
    core_test_fail("out->type == EXR_ATTR_LINEORDER",(char *)0x616,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0xd;
  eVar1 = exr_attr_list_add(f,&local_58,"n",EXR_ATTR_M33F,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"n\", EXR_ATTR_M33F, 0, __null, &out)",(char *)0x618
                   ,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_M33F) {
    core_test_fail("out->type == EXR_ATTR_M33F",(char *)0x619,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0xe;
  eVar1 = exr_attr_list_add(f,&local_58,"o",EXR_ATTR_M33D,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"o\", EXR_ATTR_M33D, 0, __null, &out)",(char *)0x61b
                   ,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_M33D) {
    core_test_fail("out->type == EXR_ATTR_M33D",(char *)0x61c,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0xf;
  eVar1 = exr_attr_list_add(f,&local_58,"p",EXR_ATTR_M44F,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"p\", EXR_ATTR_M44F, 0, __null, &out)",(char *)0x61e
                   ,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_M44F) {
    core_test_fail("out->type == EXR_ATTR_M44F",(char *)0x61f,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x10;
  eVar1 = exr_attr_list_add(f,&local_58,"q",EXR_ATTR_M44D,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"q\", EXR_ATTR_M44D, 0, __null, &out)",(char *)0x621
                   ,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_M44D) {
    core_test_fail("out->type == EXR_ATTR_M44D",(char *)0x622,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x11;
  eVar1 = exr_attr_list_add(f,&local_58,"r",EXR_ATTR_PREVIEW,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"r\", EXR_ATTR_PREVIEW, 0, __null, &out)",
                   (char *)0x624,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_PREVIEW) {
    core_test_fail("out->type == EXR_ATTR_PREVIEW",(char *)0x625,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x12;
  eVar1 = exr_attr_list_add(f,&local_58,"s",EXR_ATTR_RATIONAL,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"s\", EXR_ATTR_RATIONAL, 0, __null, &out)",
                   (char *)0x627,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_RATIONAL) {
    core_test_fail("out->type == EXR_ATTR_RATIONAL",(char *)0x628,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x13;
  eVar1 = exr_attr_list_add(f,&local_58,"t",EXR_ATTR_STRING,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"t\", EXR_ATTR_STRING, 0, __null, &out)",
                   (char *)0x62a,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_STRING) {
    core_test_fail("out->type == EXR_ATTR_STRING",(char *)0x62b,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x14;
  eVar1 = exr_attr_list_add(f,&local_58,"u",EXR_ATTR_STRING_VECTOR,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"u\", EXR_ATTR_STRING_VECTOR, 0, __null, &out)",
                   (char *)0x62d,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_STRING_VECTOR) {
    core_test_fail("out->type == EXR_ATTR_STRING_VECTOR",(char *)0x62e,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x15;
  eVar1 = exr_attr_list_add(f,&local_58,"v",EXR_ATTR_TILEDESC,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"v\", EXR_ATTR_TILEDESC, 0, __null, &out)",
                   (char *)0x630,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_TILEDESC) {
    core_test_fail("out->type == EXR_ATTR_TILEDESC",(char *)0x631,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x16;
  eVar1 = exr_attr_list_add(f,&local_58,"w",EXR_ATTR_TIMECODE,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"w\", EXR_ATTR_TIMECODE, 0, __null, &out)",
                   (char *)0x633,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_TIMECODE) {
    core_test_fail("out->type == EXR_ATTR_TIMECODE",(char *)0x634,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x17;
  eVar1 = exr_attr_list_add(f,&local_58,"x",EXR_ATTR_V2I,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"x\", EXR_ATTR_V2I, 0, __null, &out)",(char *)0x636,
                   0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_V2I) {
    core_test_fail("out->type == EXR_ATTR_V2I",(char *)0x637,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x18;
  eVar1 = exr_attr_list_add(f,&local_58,"y",EXR_ATTR_V2F,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"y\", EXR_ATTR_V2F, 0, __null, &out)",(char *)0x639,
                   0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_V2F) {
    core_test_fail("out->type == EXR_ATTR_V2F",(char *)0x63a,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x19;
  eVar1 = exr_attr_list_add(f,&local_58,"z",EXR_ATTR_V2D,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"z\", EXR_ATTR_V2D, 0, __null, &out)",(char *)0x63c,
                   0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_V2D) {
    core_test_fail("out->type == EXR_ATTR_V2D",(char *)0x63d,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x1a;
  eVar1 = exr_attr_list_add(f,&local_58,"0",EXR_ATTR_V3I,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"0\", EXR_ATTR_V3I, 0, __null, &out)",(char *)0x63f,
                   0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_V3I) {
    core_test_fail("out->type == EXR_ATTR_V3I",(char *)0x640,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x1b;
  eVar1 = exr_attr_list_add(f,&local_58,"1",EXR_ATTR_V3F,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"1\", EXR_ATTR_V3F, 0, __null, &out)",(char *)0x642,
                   0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_V3F) {
    core_test_fail("out->type == EXR_ATTR_V3F",(char *)0x643,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x1c;
  eVar1 = exr_attr_list_add(f,&local_58,"2",EXR_ATTR_V3D,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add (f, &al, \"2\", EXR_ATTR_V3D, 0, __null, &out)",(char *)0x645,
                   0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_V3D) {
    core_test_fail("out->type == EXR_ATTR_V3D",(char *)0x646,0x34a949,pcVar5);
  }
  if (local_58.num_attributes != 0x1c) {
    core_test_fail("al.num_attributes == 28",(char *)0x647,0x34a949,pcVar5);
  }
  exr_attr_list_destroy(f,&local_58);
  pcVar5 = (char *)0x1;
  eVar1 = exr_attr_list_add_static_name(f,&local_58,"b",EXR_ATTR_BOX2I,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"b\", EXR_ATTR_BOX2I, 0, __null, &out)"
                   ,(char *)0x650,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_BOX2I) {
    core_test_fail("out->type == EXR_ATTR_BOX2I",(char *)0x651,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x1;
  eVar1 = exr_attr_list_add_static_name(f,&local_58,"b",EXR_ATTR_BOX2I,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"b\", EXR_ATTR_BOX2I, 0, __null, &out)"
                   ,(char *)0x653,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_BOX2I) {
    core_test_fail("out->type == EXR_ATTR_BOX2I",(char *)0x654,0x34a949,pcVar5);
  }
  if (local_58.num_attributes != 1) {
    core_test_fail("al.num_attributes == 1",(char *)0x655,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x2;
  eVar1 = exr_attr_list_add_static_name(f,&local_58,"b",EXR_ATTR_BOX2F,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"b\", EXR_ATTR_BOX2F, 0, __null, &out)"
                   ,(char *)0x659,0x34a949,pcVar5);
  }
  if (local_60 != (exr_attribute_t *)0x0) {
    core_test_fail("out == __null",(char *)0x65a,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x1;
  eVar1 = exr_attr_list_add_static_name
                    (f,&local_58,"reallongreallongreallonglongname",EXR_ATTR_BOX2I,0,(uint8_t **)0x0
                     ,&local_60);
  if (eVar1 != 0xc) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(0xc);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"reallongreallongreallonglongname\", EXR_ATTR_BOX2I, 0, __null, &out)"
                   ,(char *)0x665,0x34a949,pcVar5);
  }
  if (local_58.num_attributes != 1) {
    core_test_fail("al.num_attributes == 1",(char *)0x666,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x1e;
  eVar1 = exr_attr_list_add_static_name(f,&local_58,"c",EXR_ATTR_OPAQUE,0,(uint8_t **)0x0,&local_60)
  ;
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"c\", EXR_ATTR_OPAQUE, 0, __null, &out)"
                   ,(char *)0x66a,0x34a949,pcVar5);
  }
  if (local_58.num_attributes != 1) {
    core_test_fail("al.num_attributes == 1",(char *)0x66b,0x34a949,pcVar5);
  }
  s_malloc_fail_on = 1;
  pcVar5 = (char *)0x2;
  eVar1 = exr_attr_list_add_static_name(f,&local_58,"c",EXR_ATTR_BOX2F,0,(uint8_t **)0x0,&local_60);
  s_malloc_fail_on = 0;
  if (eVar1 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"c\", EXR_ATTR_BOX2F, 0, __null, &out)"
                   ,(char *)0x670,0x34a949,pcVar5);
  }
  if (local_58.num_attributes != 1) {
    core_test_fail("al.num_attributes == 1",(char *)0x671,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x2;
  eVar1 = exr_attr_list_add_static_name(f,&local_58,"c",EXR_ATTR_BOX2F,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"c\", EXR_ATTR_BOX2F, 0, __null, &out)"
                   ,(char *)0x674,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_BOX2F) {
    core_test_fail("out->type == EXR_ATTR_BOX2F",(char *)0x675,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x3;
  eVar1 = exr_attr_list_add_static_name(f,&local_58,"d",EXR_ATTR_CHLIST,0,(uint8_t **)0x0,&local_60)
  ;
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"d\", EXR_ATTR_CHLIST, 0, __null, &out)"
                   ,(char *)0x677,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_CHLIST) {
    core_test_fail("out->type == EXR_ATTR_CHLIST",(char *)0x678,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x4;
  eVar1 = exr_attr_list_add_static_name
                    (f,&local_58,"e",EXR_ATTR_CHROMATICITIES,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"e\", EXR_ATTR_CHROMATICITIES, 0, __null, &out)"
                   ,(char *)0x67a,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_CHROMATICITIES) {
    core_test_fail("out->type == EXR_ATTR_CHROMATICITIES",(char *)0x67b,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x5;
  eVar1 = exr_attr_list_add_static_name
                    (f,&local_58,"f",EXR_ATTR_COMPRESSION,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"f\", EXR_ATTR_COMPRESSION, 0, __null, &out)"
                   ,(char *)0x67d,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_COMPRESSION) {
    core_test_fail("out->type == EXR_ATTR_COMPRESSION",(char *)0x67e,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x6;
  eVar1 = exr_attr_list_add_static_name(f,&local_58,"g",EXR_ATTR_DOUBLE,0,(uint8_t **)0x0,&local_60)
  ;
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"g\", EXR_ATTR_DOUBLE, 0, __null, &out)"
                   ,(char *)0x680,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_DOUBLE) {
    core_test_fail("out->type == EXR_ATTR_DOUBLE",(char *)0x681,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x7;
  eVar1 = exr_attr_list_add_static_name(f,&local_58,"h",EXR_ATTR_ENVMAP,0,(uint8_t **)0x0,&local_60)
  ;
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"h\", EXR_ATTR_ENVMAP, 0, __null, &out)"
                   ,(char *)0x683,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_ENVMAP) {
    core_test_fail("out->type == EXR_ATTR_ENVMAP",(char *)0x684,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x8;
  eVar1 = exr_attr_list_add_static_name(f,&local_58,"i",EXR_ATTR_FLOAT,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"i\", EXR_ATTR_FLOAT, 0, __null, &out)"
                   ,(char *)0x686,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_FLOAT) {
    core_test_fail("out->type == EXR_ATTR_FLOAT",(char *)0x687,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x9;
  eVar1 = exr_attr_list_add_static_name
                    (f,&local_58,"j",EXR_ATTR_FLOAT_VECTOR,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"j\", EXR_ATTR_FLOAT_VECTOR, 0, __null, &out)"
                   ,(char *)0x689,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_FLOAT_VECTOR) {
    core_test_fail("out->type == EXR_ATTR_FLOAT_VECTOR",(char *)0x68a,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0xa;
  eVar1 = exr_attr_list_add_static_name(f,&local_58,"k",EXR_ATTR_INT,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"k\", EXR_ATTR_INT, 0, __null, &out)",
                   (char *)0x68c,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_INT) {
    core_test_fail("out->type == EXR_ATTR_INT",(char *)0x68d,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0xb;
  eVar1 = exr_attr_list_add_static_name
                    (f,&local_58,"l",EXR_ATTR_KEYCODE,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"l\", EXR_ATTR_KEYCODE, 0, __null, &out)"
                   ,(char *)0x68f,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_KEYCODE) {
    core_test_fail("out->type == EXR_ATTR_KEYCODE",(char *)0x690,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0xc;
  eVar1 = exr_attr_list_add_static_name
                    (f,&local_58,"m",EXR_ATTR_LINEORDER,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"m\", EXR_ATTR_LINEORDER, 0, __null, &out)"
                   ,(char *)0x692,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_LINEORDER) {
    core_test_fail("out->type == EXR_ATTR_LINEORDER",(char *)0x693,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0xd;
  eVar1 = exr_attr_list_add_static_name(f,&local_58,"n",EXR_ATTR_M33F,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"n\", EXR_ATTR_M33F, 0, __null, &out)",
                   (char *)0x695,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_M33F) {
    core_test_fail("out->type == EXR_ATTR_M33F",(char *)0x696,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0xe;
  eVar1 = exr_attr_list_add_static_name(f,&local_58,"o",EXR_ATTR_M33D,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"o\", EXR_ATTR_M33D, 0, __null, &out)",
                   (char *)0x698,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_M33D) {
    core_test_fail("out->type == EXR_ATTR_M33D",(char *)0x699,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0xf;
  eVar1 = exr_attr_list_add_static_name(f,&local_58,"p",EXR_ATTR_M44F,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"p\", EXR_ATTR_M44F, 0, __null, &out)",
                   (char *)0x69b,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_M44F) {
    core_test_fail("out->type == EXR_ATTR_M44F",(char *)0x69c,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x10;
  eVar1 = exr_attr_list_add_static_name(f,&local_58,"q",EXR_ATTR_M44D,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"q\", EXR_ATTR_M44D, 0, __null, &out)",
                   (char *)0x69e,0x34a949,pcVar5);
  }
  if (local_60->type != EXR_ATTR_M44D) {
    core_test_fail("out->type == EXR_ATTR_M44D",(char *)0x69f,0x34a949,pcVar5);
  }
  pcVar5 = (char *)0x11;
  eVar1 = exr_attr_list_add_static_name
                    (f,&local_58,"r",EXR_ATTR_PREVIEW,0,(uint8_t **)0x0,&local_60);
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_list_add_static_name ( f, &al, \"r\", EXR_ATTR_PREVIEW, 0, __null, &out)"
                   ,(char *)0x6a1,0x34a949,pcVar5);
  }
  if (local_60->type == EXR_ATTR_PREVIEW) {
    pcVar5 = (char *)0x12;
    eVar1 = exr_attr_list_add_static_name
                      (f,&local_58,"s",EXR_ATTR_RATIONAL,0,(uint8_t **)0x0,&local_60);
    if (eVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(eVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_attr_list_add_static_name ( f, &al, \"s\", EXR_ATTR_RATIONAL, 0, __null, &out)"
                     ,(char *)0x6a4,0x34a949,pcVar5);
    }
    if (local_60->type != EXR_ATTR_RATIONAL) {
      core_test_fail("out->type == EXR_ATTR_RATIONAL",(char *)0x6a5,0x34a949,pcVar5);
    }
    pcVar5 = (char *)0x13;
    eVar1 = exr_attr_list_add_static_name
                      (f,&local_58,"t",EXR_ATTR_STRING,0,(uint8_t **)0x0,&local_60);
    if (eVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(eVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_attr_list_add_static_name ( f, &al, \"t\", EXR_ATTR_STRING, 0, __null, &out)"
                     ,(char *)0x6a7,0x34a949,pcVar5);
    }
    if (local_60->type != EXR_ATTR_STRING) {
      core_test_fail("out->type == EXR_ATTR_STRING",(char *)0x6a8,0x34a949,pcVar5);
    }
    pcVar5 = (char *)0x14;
    eVar1 = exr_attr_list_add_static_name
                      (f,&local_58,"u",EXR_ATTR_STRING_VECTOR,0,(uint8_t **)0x0,&local_60);
    if (eVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(eVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_attr_list_add_static_name ( f, &al, \"u\", EXR_ATTR_STRING_VECTOR, 0, __null, &out)"
                     ,(char *)0x6aa,0x34a949,pcVar5);
    }
    if (local_60->type != EXR_ATTR_STRING_VECTOR) {
      core_test_fail("out->type == EXR_ATTR_STRING_VECTOR",(char *)0x6ab,0x34a949,pcVar5);
    }
    pcVar5 = (char *)0x15;
    eVar1 = exr_attr_list_add_static_name
                      (f,&local_58,"v",EXR_ATTR_TILEDESC,0,(uint8_t **)0x0,&local_60);
    if (eVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(eVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_attr_list_add_static_name ( f, &al, \"v\", EXR_ATTR_TILEDESC, 0, __null, &out)"
                     ,(char *)0x6ad,0x34a949,pcVar5);
    }
    if (local_60->type != EXR_ATTR_TILEDESC) {
      core_test_fail("out->type == EXR_ATTR_TILEDESC",(char *)0x6ae,0x34a949,pcVar5);
    }
    pcVar5 = (char *)0x16;
    eVar1 = exr_attr_list_add_static_name
                      (f,&local_58,"w",EXR_ATTR_TIMECODE,0,(uint8_t **)0x0,&local_60);
    if (eVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(eVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_attr_list_add_static_name ( f, &al, \"w\", EXR_ATTR_TIMECODE, 0, __null, &out)"
                     ,(char *)0x6b0,0x34a949,pcVar5);
    }
    if (local_60->type != EXR_ATTR_TIMECODE) {
      core_test_fail("out->type == EXR_ATTR_TIMECODE",(char *)0x6b1,0x34a949,pcVar5);
    }
    pcVar5 = (char *)0x17;
    eVar1 = exr_attr_list_add_static_name(f,&local_58,"x",EXR_ATTR_V2I,0,(uint8_t **)0x0,&local_60);
    if (eVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(eVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_attr_list_add_static_name ( f, &al, \"x\", EXR_ATTR_V2I, 0, __null, &out)"
                     ,(char *)0x6b3,0x34a949,pcVar5);
    }
    if (local_60->type != EXR_ATTR_V2I) {
      core_test_fail("out->type == EXR_ATTR_V2I",(char *)0x6b4,0x34a949,pcVar5);
    }
    pcVar5 = (char *)0x18;
    eVar1 = exr_attr_list_add_static_name(f,&local_58,"y",EXR_ATTR_V2F,0,(uint8_t **)0x0,&local_60);
    if (eVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(eVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_attr_list_add_static_name ( f, &al, \"y\", EXR_ATTR_V2F, 0, __null, &out)"
                     ,(char *)0x6b6,0x34a949,pcVar5);
    }
    if (local_60->type != EXR_ATTR_V2F) {
      core_test_fail("out->type == EXR_ATTR_V2F",(char *)0x6b7,0x34a949,pcVar5);
    }
    pcVar5 = (char *)0x19;
    eVar1 = exr_attr_list_add_static_name(f,&local_58,"z",EXR_ATTR_V2D,0,(uint8_t **)0x0,&local_60);
    if (eVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(eVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_attr_list_add_static_name ( f, &al, \"z\", EXR_ATTR_V2D, 0, __null, &out)"
                     ,(char *)0x6b9,0x34a949,pcVar5);
    }
    if (local_60->type == EXR_ATTR_V2D) {
      pcVar5 = (char *)0x1a;
      eVar1 = exr_attr_list_add_static_name
                        (f,&local_58,"0",EXR_ATTR_V3I,0,(uint8_t **)0x0,&local_60);
      if (eVar1 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(eVar1);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
        }
        else {
          sVar3 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        core_test_fail("exr_attr_list_add_static_name ( f, &al, \"0\", EXR_ATTR_V3I, 0, __null, &out)"
                       ,(char *)0x6bc,0x34a949,pcVar5);
      }
      if (local_60->type != EXR_ATTR_V3I) {
        core_test_fail("out->type == EXR_ATTR_V3I",(char *)0x6bd,0x34a949,pcVar5);
      }
      pcVar5 = (char *)0x1b;
      eVar1 = exr_attr_list_add_static_name
                        (f,&local_58,"1",EXR_ATTR_V3F,0,(uint8_t **)0x0,&local_60);
      if (eVar1 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(eVar1);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
        }
        else {
          sVar3 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        core_test_fail("exr_attr_list_add_static_name ( f, &al, \"1\", EXR_ATTR_V3F, 0, __null, &out)"
                       ,(char *)0x6bf,0x34a949,pcVar5);
      }
      if (local_60->type == EXR_ATTR_V3F) {
        pcVar5 = (char *)0x1c;
        eVar1 = exr_attr_list_add_static_name
                          (f,&local_58,"2",EXR_ATTR_V3D,0,(uint8_t **)0x0,&local_60);
        if (eVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
          pcVar6 = (char *)exr_get_default_error_message(eVar1);
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
          }
          else {
            sVar3 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          core_test_fail("exr_attr_list_add_static_name ( f, &al, \"2\", EXR_ATTR_V3D, 0, __null, &out)"
                         ,(char *)0x6c2,0x34a949,pcVar5);
        }
        if (local_60->type == EXR_ATTR_V3D) {
          if (local_58.num_attributes == 0x1c) {
            exr_attr_list_destroy(f,&local_58);
            return;
          }
          core_test_fail("al.num_attributes == 28",(char *)0x6c4,0x34a949,pcVar5);
        }
        core_test_fail("out->type == EXR_ATTR_V3D",(char *)0x6c3,0x34a949,pcVar5);
      }
      core_test_fail("out->type == EXR_ATTR_V3F",(char *)0x6c0,0x34a949,pcVar5);
    }
    core_test_fail("out->type == EXR_ATTR_V2D",(char *)0x6ba,0x34a949,pcVar5);
  }
  core_test_fail("out->type == EXR_ATTR_PREVIEW",(char *)0x6a2,0x34a949,pcVar5);
}

Assistant:

static void
testAttrListHelper (exr_context_t f)
{
    exr_attribute_list_t al = {0};
    exr_attribute_t*     out;
    exr_attribute_t*     out2;
    uint8_t*             extra;
    uint64_t             sz;

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_attr_list_destroy (NULL, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_attr_list_destroy (NULL, &al));
    EXRCORE_TEST_RVAL (exr_attr_list_destroy (f, NULL));
    EXRCORE_TEST_RVAL (exr_attr_list_destroy (f, &al));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NO_ATTR_BY_NAME,
        exr_attr_list_find_by_name (f, &al, "exr", &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_list_find_by_name (NULL, &al, "exr", &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_find_by_name (f, NULL, "exr", &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_find_by_name (f, &al, "exr", NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_find_by_name (f, &al, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_find_by_name (f, &al, "", &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_list_compute_size (f, NULL, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_list_compute_size (f, &al, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_list_compute_size (NULL, &al, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_list_compute_size (f, NULL, &sz));
    EXRCORE_TEST_RVAL (exr_attr_list_compute_size (f, &al, &sz));
    EXRCORE_TEST (0 == sz);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_by_type (f, NULL, "myattr", "mytype", 0, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_by_type (f, &al, NULL, "mytype", 0, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_by_type (f, &al, "", "mytype", 0, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_by_type (f, &al, "myattr", NULL, 0, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_by_type (f, &al, "myattr", "", 0, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_by_type (f, &al, "myattr", "mytype", 0, NULL, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_by_type (f, &al, "myattr", "mytype", -1, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_by_type (f, &al, "myattr", "mytype", 1, NULL, &out));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_by_type (f, NULL, "myattr", "mytype", 1, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_by_type (f, &al, "myattr", "mytype", 1, NULL, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_by_type (f, &al, "myattr", "mytype", -1, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_by_type (f, &al, "myattr", "mytype", 1, NULL, &out));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NAME_TOO_LONG,
        exr_attr_list_add_by_type (
            f,
            &al,
            "reallongreallongreallonglongname",
            "box2i",
            0,
            NULL,
            &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NAME_TOO_LONG,
        exr_attr_list_add_by_type (
            f, &al, "x", "reallongreallongreallonglongname", 0, NULL, &out));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_list_add (
            NULL, &al, "myattr", EXR_ATTR_STRING, 0, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add (f, NULL, "myattr", EXR_ATTR_STRING, 0, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add (f, &al, NULL, EXR_ATTR_STRING, 0, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add (f, &al, "", EXR_ATTR_STRING, 0, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add (
            f, &al, "myattr", EXR_ATTR_LAST_KNOWN_TYPE, 0, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add (f, &al, "myattr", EXR_ATTR_UNKNOWN, 0, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add (
            f, &al, "myattr", (exr_attribute_type_t) -1, 0, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add (f, &al, "myattr", EXR_ATTR_STRING, 0, NULL, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add (f, &al, "myattr", EXR_ATTR_STRING, -1, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add (f, &al, "myattr", EXR_ATTR_STRING, 1, NULL, &out));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_static_name (
            f, NULL, "myattr", EXR_ATTR_STRING, 0, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_static_name (
            f, &al, NULL, EXR_ATTR_STRING, 0, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_static_name (
            f, &al, "", EXR_ATTR_STRING, 0, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_static_name (
            f, &al, "myattr", EXR_ATTR_LAST_KNOWN_TYPE, 0, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_static_name (
            f, &al, "myattr", EXR_ATTR_UNKNOWN, 0, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_static_name (
            f, &al, "myattr", (exr_attribute_type_t) -1, 0, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_static_name (
            f, &al, "myattr", EXR_ATTR_STRING, 0, NULL, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_static_name (
            f, &al, "myattr", EXR_ATTR_STRING, -1, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_static_name (
            f, &al, "myattr", EXR_ATTR_STRING, 1, NULL, &out));

    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "myattr", EXR_ATTR_STRING, 0, NULL, &out));
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "xxx", EXR_ATTR_STRING, 0, NULL, &out2));
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "yyy", EXR_ATTR_STRING, 0, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_attr_list_remove (NULL, &al, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_list_remove (f, NULL, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_list_remove (f, &al, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_list_remove (f, NULL, out));
    EXRCORE_TEST_RVAL (exr_attr_list_remove (f, &al, out2));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_list_remove (f, &al, out2));
    EXRCORE_TEST (al.num_attributes == 2);

    EXRCORE_TEST_RVAL (exr_attr_list_add_by_type (
        f, &al, "tnst42", "string", 42, &extra, &out));
    EXRCORE_TEST (extra != NULL);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "tnst0", "string", 0, &extra, &out));
    EXRCORE_TEST (extra == NULL);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "nst42", EXR_ATTR_STRING, 42, &extra, &out));
    EXRCORE_TEST (extra != NULL);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "nst0", EXR_ATTR_STRING, 0, &extra, &out));
    EXRCORE_TEST (extra == NULL);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "t42", EXR_ATTR_STRING, 42, &extra, &out));
    EXRCORE_TEST (extra != NULL);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "t0", EXR_ATTR_STRING, 0, &extra, &out));
    EXRCORE_TEST (extra == NULL);
    // by destroying the list here, if extra is leaking, valgrind will find something
    exr_attr_list_destroy (f, &al);

    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "a", "mytype", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_OPAQUE);
    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY,
        exr_attr_list_add_by_type (f, &al, "zzzz", "mytype", 0, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_list_add_by_type (NULL, &al, "a", "box2i", 0, NULL, &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_by_type (f, &al, "a", "box2i", 0, NULL, &out));

    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "b", "box2i", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_BOX2I);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "b", "box2i", 0, NULL, &out));
    EXRCORE_TEST (al.num_attributes == 2);
    EXRCORE_TEST (out->type == EXR_ATTR_BOX2I);
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_by_type (f, &al, "b", "box2i", 3, &extra, &out));
    EXRCORE_TEST (al.num_attributes == 2);

    EXRCORE_TEST (al.num_alloced == 2);
    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY,
        exr_attr_list_add_by_type (f, &al, "c", "box2f", 0, NULL, &out));
    EXRCORE_TEST (al.num_attributes == 2);
    EXRCORE_TEST (al.num_alloced == 2);
    EXRCORE_TEST_RVAL_FAIL_MALLOC_AFTER (
        1,
        EXR_ERR_OUT_OF_MEMORY,
        exr_attr_list_add_by_type (f, &al, "c", "box2f", 0, NULL, &out));
    EXRCORE_TEST (al.num_attributes == 2);

    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "c", "box2f", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_BOX2F);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "d", "chlist", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_CHLIST);
    EXRCORE_TEST_RVAL (exr_attr_chlist_add (
        f,
        out->chlist,
        "R",
        EXR_PIXEL_HALF,
        EXR_PERCEPTUALLY_LOGARITHMIC,
        1,
        1));
    EXRCORE_TEST_RVAL (exr_attr_chlist_add (
        f,
        out->chlist,
        "G",
        EXR_PIXEL_HALF,
        EXR_PERCEPTUALLY_LOGARITHMIC,
        1,
        1));
    EXRCORE_TEST_RVAL (exr_attr_chlist_add (
        f,
        out->chlist,
        "B",
        EXR_PIXEL_HALF,
        EXR_PERCEPTUALLY_LOGARITHMIC,
        1,
        1));

    EXRCORE_TEST_RVAL (exr_attr_list_add_by_type (
        f, &al, "e", "chromaticities", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_CHROMATICITIES);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "f", "compression", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_COMPRESSION);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "g", "double", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_DOUBLE);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "h", "envmap", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_ENVMAP);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "i", "float", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_FLOAT);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "j", "floatvector", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_FLOAT_VECTOR);
    EXRCORE_TEST_RVAL (exr_attr_float_vector_init (f, out->floatvector, 4));

    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "k", "int", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_INT);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "l", "keycode", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_KEYCODE);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "m", "lineOrder", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_LINEORDER);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "n", "m33f", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_M33F);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "o", "m33d", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_M33D);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "p", "m44f", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_M44F);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "q", "m44d", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_M44D);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "r", "preview", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_PREVIEW);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "s", "rational", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_RATIONAL);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "t", "string", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_STRING);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "u", "stringvector", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_STRING_VECTOR);
    EXRCORE_TEST_RVAL (
        exr_attr_string_vector_add_entry (f, out->stringvector, "openexr"));

    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "v", "tiledesc", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_TILEDESC);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "w", "timecode", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_TIMECODE);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "x", "v2i", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_V2I);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "y", "v2f", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_V2F);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "z", "v2d", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_V2D);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "0", "v3i", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_V3I);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "1", "v3f", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_V3F);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add_by_type (f, &al, "2", "v3d", 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_V3D);
    EXRCORE_TEST (al.num_attributes == 29);
    EXRCORE_TEST_RVAL (exr_attr_list_compute_size (f, &al, &sz));
    EXRCORE_TEST_RVAL (exr_attr_list_find_by_name (f, &al, "x", &out));
    EXRCORE_TEST (out->type == EXR_ATTR_V2I);
    EXRCORE_TEST_RVAL (exr_attr_list_find_by_name (f, &al, "a", &out));
    EXRCORE_TEST (out->type == EXR_ATTR_OPAQUE);

    exr_attr_list_destroy (f, &al);
    // double check double delete
    exr_attr_list_destroy (f, &al);

    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "b", EXR_ATTR_BOX2I, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_BOX2I);
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add (f, &al, "b", EXR_ATTR_BOX2F, 0, NULL, &out));
    EXRCORE_TEST (out == NULL);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "b", EXR_ATTR_BOX2I, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_BOX2I);
    EXRCORE_TEST (al.num_attributes == 1);
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NAME_TOO_LONG,
        exr_attr_list_add (
            f,
            &al,
            "reallongreallongreallonglongname",
            EXR_ATTR_BOX2I,
            0,
            NULL,
            &out));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add (f, &al, "yyy", EXR_ATTR_OPAQUE, 0, NULL, &out));

    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY,
        exr_attr_list_add (f, &al, "c", EXR_ATTR_BOX2F, 0, NULL, &out));
    EXRCORE_TEST (al.num_attributes == 1);

    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "c", EXR_ATTR_BOX2F, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_BOX2F);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "d", EXR_ATTR_CHLIST, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_CHLIST);
    EXRCORE_TEST_RVAL (exr_attr_list_add (
        f, &al, "e", EXR_ATTR_CHROMATICITIES, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_CHROMATICITIES);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "f", EXR_ATTR_COMPRESSION, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_COMPRESSION);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "g", EXR_ATTR_DOUBLE, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_DOUBLE);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "h", EXR_ATTR_ENVMAP, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_ENVMAP);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "i", EXR_ATTR_FLOAT, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_FLOAT);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "j", EXR_ATTR_FLOAT_VECTOR, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_FLOAT_VECTOR);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "k", EXR_ATTR_INT, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_INT);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "l", EXR_ATTR_KEYCODE, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_KEYCODE);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "m", EXR_ATTR_LINEORDER, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_LINEORDER);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "n", EXR_ATTR_M33F, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_M33F);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "o", EXR_ATTR_M33D, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_M33D);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "p", EXR_ATTR_M44F, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_M44F);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "q", EXR_ATTR_M44D, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_M44D);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "r", EXR_ATTR_PREVIEW, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_PREVIEW);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "s", EXR_ATTR_RATIONAL, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_RATIONAL);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "t", EXR_ATTR_STRING, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_STRING);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "u", EXR_ATTR_STRING_VECTOR, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_STRING_VECTOR);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "v", EXR_ATTR_TILEDESC, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_TILEDESC);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "w", EXR_ATTR_TIMECODE, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_TIMECODE);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "x", EXR_ATTR_V2I, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_V2I);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "y", EXR_ATTR_V2F, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_V2F);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "z", EXR_ATTR_V2D, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_V2D);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "0", EXR_ATTR_V3I, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_V3I);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "1", EXR_ATTR_V3F, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_V3F);
    EXRCORE_TEST_RVAL (
        exr_attr_list_add (f, &al, "2", EXR_ATTR_V3D, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_V3D);
    EXRCORE_TEST (al.num_attributes == 28);

    exr_attr_list_destroy (f, &al);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_list_add_static_name (
            NULL, &al, "b", EXR_ATTR_BOX2F, 0, NULL, &out));
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "b", EXR_ATTR_BOX2I, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_BOX2I);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "b", EXR_ATTR_BOX2I, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_BOX2I);
    EXRCORE_TEST (al.num_attributes == 1);
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_static_name (
            f, &al, "b", EXR_ATTR_BOX2F, 0, NULL, &out));
    EXRCORE_TEST (out == NULL);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NAME_TOO_LONG,
        exr_attr_list_add_static_name (
            f,
            &al,
            "reallongreallongreallonglongname",
            EXR_ATTR_BOX2I,
            0,
            NULL,
            &out));
    EXRCORE_TEST (al.num_attributes == 1);
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_list_add_static_name (
            f, &al, "c", EXR_ATTR_OPAQUE, 0, NULL, &out));
    EXRCORE_TEST (al.num_attributes == 1);

    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY,
        exr_attr_list_add_static_name (
            f, &al, "c", EXR_ATTR_BOX2F, 0, NULL, &out));
    EXRCORE_TEST (al.num_attributes == 1);

    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "c", EXR_ATTR_BOX2F, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_BOX2F);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "d", EXR_ATTR_CHLIST, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_CHLIST);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "e", EXR_ATTR_CHROMATICITIES, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_CHROMATICITIES);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "f", EXR_ATTR_COMPRESSION, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_COMPRESSION);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "g", EXR_ATTR_DOUBLE, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_DOUBLE);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "h", EXR_ATTR_ENVMAP, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_ENVMAP);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "i", EXR_ATTR_FLOAT, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_FLOAT);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "j", EXR_ATTR_FLOAT_VECTOR, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_FLOAT_VECTOR);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "k", EXR_ATTR_INT, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_INT);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "l", EXR_ATTR_KEYCODE, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_KEYCODE);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "m", EXR_ATTR_LINEORDER, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_LINEORDER);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "n", EXR_ATTR_M33F, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_M33F);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "o", EXR_ATTR_M33D, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_M33D);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "p", EXR_ATTR_M44F, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_M44F);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "q", EXR_ATTR_M44D, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_M44D);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "r", EXR_ATTR_PREVIEW, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_PREVIEW);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "s", EXR_ATTR_RATIONAL, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_RATIONAL);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "t", EXR_ATTR_STRING, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_STRING);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "u", EXR_ATTR_STRING_VECTOR, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_STRING_VECTOR);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "v", EXR_ATTR_TILEDESC, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_TILEDESC);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "w", EXR_ATTR_TIMECODE, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_TIMECODE);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "x", EXR_ATTR_V2I, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_V2I);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "y", EXR_ATTR_V2F, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_V2F);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "z", EXR_ATTR_V2D, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_V2D);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "0", EXR_ATTR_V3I, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_V3I);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "1", EXR_ATTR_V3F, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_V3F);
    EXRCORE_TEST_RVAL (exr_attr_list_add_static_name (
        f, &al, "2", EXR_ATTR_V3D, 0, NULL, &out));
    EXRCORE_TEST (out->type == EXR_ATTR_V3D);
    EXRCORE_TEST (al.num_attributes == 28);

    exr_attr_list_destroy (f, &al);
}